

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void * operator_new(size_t size)

{
  void *p;
  void *ptr;
  size_t size_local;
  
  p = debug_cpp_alloc(size,-0x145237f,false);
  tcmalloc::InvokeNewHook(p,size);
  if (p == (void *)0x0) {
    RAW_LOG(-4,"Unable to allocate %zu bytes: new failed.",size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_new(size_t size) {
  void* ptr = debug_cpp_alloc(size, MallocBlock::kNewType, false);
  tcmalloc::InvokeNewHook(ptr, size);
  if (ptr == nullptr) {
    RAW_LOG(FATAL, "Unable to allocate %zu bytes: new failed.", size);
  }
  return ptr;
}